

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O2

void do_cmd_run(command *cmd)

{
  loc grid;
  _Bool _Var1;
  wchar_t wVar2;
  trap_kind_conflict *ptVar3;
  loc lVar4;
  wchar_t *pwVar5;
  wchar_t *pwVar6;
  wchar_t dir;
  
  wVar2 = cmd_get_direction((command_conflict *)cmd,"direction",&dir,false);
  if (wVar2 == L'\0') {
    lVar4.x = (player->grid).x;
    lVar4.y = (player->grid).y;
    _Var1 = square_iswebbed(cave,lVar4);
    if (_Var1) {
      ptVar3 = lookup_trap("web");
      msg("You clear the web.");
      if (ptVar3 == (trap_kind_conflict *)0x0) {
        __assert_fail("web",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/cmd-cave.c"
                      ,0x63d,"void do_cmd_run(struct command *)");
      }
      grid.x = (player->grid).x;
      grid.y = (player->grid).y;
      square_remove_all_traps_of_type((chunk *)cave,grid,ptVar3->tidx);
      player->upkeep->energy_use = (uint)z_info->move_energy;
    }
    else {
      _Var1 = player_confuse_dir(player,&dir,true);
      if (!_Var1) {
        if ((long)dir != 0) {
          lVar4 = (loc)loc_sum(player->grid,(loc_conflict)ddgrid[dir]);
          _Var1 = do_cmd_walk_test(player,lVar4);
          if (!_Var1) {
            return;
          }
          pwVar5 = &player->upkeep->running;
          pwVar6 = pwVar5;
          if (L'\0' < cmd->nrepeats) {
            pwVar6 = &cmd->nrepeats;
            *pwVar5 = cmd->nrepeats;
          }
          *pwVar6 = L'\0';
        }
        run_step(dir);
      }
    }
  }
  return;
}

Assistant:

void do_cmd_run(struct command *cmd)
{
	struct loc grid;
	int dir;

	/* Get arguments */
	if (cmd_get_direction(cmd, "direction", &dir, false) != CMD_OK)
		return;

	/* If we're in a web, deal with that */
	if (square_iswebbed(cave, player->grid)) {
		/* Clear the web, finish turn */
		struct trap_kind *web = lookup_trap("web");

		msg("You clear the web.");
		assert(web);
		square_remove_all_traps_of_type(cave, player->grid, web->tidx);
		player->upkeep->energy_use = z_info->move_energy;
		return;
	}

	if (player_confuse_dir(player, &dir, true))
		return;

	/* Get location */
	if (dir) {
		grid = loc_sum(player->grid, ddgrid[dir]);
		if (!do_cmd_walk_test(player, grid))
			return;
			
		/* Hack: convert repeat count to running count */
		if (cmd->nrepeats > 0) {
			player->upkeep->running = cmd->nrepeats;
			cmd->nrepeats = 0;
		}
		else {
			player->upkeep->running = 0;
		}
	}

	/* Start run */
	run_step(dir);
}